

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O2

bool __thiscall CEditor::PopupSelectGametileOp(CEditor *this,void *pContext,CUIRect View)

{
  int iVar1;
  uint i;
  long lVar2;
  char **pID;
  long in_FS_OFFSET;
  CUIRect Button;
  CUIRect local_50;
  CUIRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pID = PopupSelectGametileOp::s_pButtonNames;
  local_40 = View;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    CUIRect::HSplitTop(&local_40,2.0,(CUIRect *)0x0,&local_40);
    CUIRect::HSplitTop(&local_40,12.0,&local_50,&local_40);
    iVar1 = DoButton_Editor(this,pID,*pID,0,&local_50,0,(char *)0x0);
    if (iVar1 != 0) {
      s_GametileOpSelected = (int)lVar2;
    }
    pID = pID + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool CEditor::PopupSelectGametileOp(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	static const char *s_pButtonNames[] = { "Clear", "Collision", "Death", "Unhookable" };
	static unsigned s_NumButtons = sizeof(s_pButtonNames) / sizeof(char*);
	CUIRect Button;

	for(unsigned i = 0; i < s_NumButtons; ++i)
	{
		View.HSplitTop(2.0f, 0, &View);
		View.HSplitTop(12.0f, &Button, &View);
		if(pEditor->DoButton_Editor(&s_pButtonNames[i], s_pButtonNames[i], 0, &Button, 0, 0))
			s_GametileOpSelected = i;
	}

	return false;
}